

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

Branch * __thiscall
kj::ArrayBuilder<kj::_::ArrayJoinPromiseNodeBase::Branch>::
add<kj::_::ArrayJoinPromiseNodeBase&,kj::Own<kj::_::PromiseNode>,kj::_::ExceptionOrValue&>
          (ArrayBuilder<kj::_::ArrayJoinPromiseNodeBase::Branch> *this,
          ArrayJoinPromiseNodeBase *params,Own<kj::_::PromiseNode> *params_1,
          ExceptionOrValue *params_2)

{
  Branch *pBVar1;
  PromiseNode *pPVar2;
  Own<kj::_::PromiseNode> local_18;
  
  pBVar1 = this->pos;
  local_18.disposer = params_1->disposer;
  local_18.ptr = params_1->ptr;
  params_1->ptr = (PromiseNode *)0x0;
  _::ArrayJoinPromiseNodeBase::Branch::Branch(pBVar1,params,&local_18,params_2);
  pPVar2 = local_18.ptr;
  if (local_18.ptr != (PromiseNode *)0x0) {
    local_18.ptr = (PromiseNode *)0x0;
    (**(local_18.disposer)->_vptr_Disposer)
              (local_18.disposer,pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode);
  }
  pBVar1 = this->pos;
  this->pos = pBVar1 + 1;
  return pBVar1;
}

Assistant:

T& add(Params&&... params) {
    KJ_IREQUIRE(pos < endPtr, "Added too many elements to ArrayBuilder.");
    ctor(*pos, kj::fwd<Params>(params)...);
    return *pos++;
  }